

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlcatalog.c
# Opt level: O1

int main(int argc,char **argv)

{
  char **ppcVar1;
  char **ppcVar2;
  byte bVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  long lVar8;
  char *pcVar9;
  size_t sVar10;
  ulong uVar11;
  FILE *pFVar12;
  byte *pbVar13;
  uint uVar14;
  uint uVar15;
  char *pcVar16;
  int iVar17;
  char *pcVar18;
  char command [100];
  char arg [400];
  int local_4d8;
  undefined4 local_4c8;
  char cStack_4c4;
  undefined1 uStack_4c3;
  undefined1 uStack_4c2;
  undefined1 uStack_4c1;
  long local_458 [20];
  byte local_3b8 [400];
  char local_228 [500];
  undefined1 local_34;
  
  if (argc < 2) {
    printf("Usage : %s [options] catalogfile entities...\n\tParse the catalog file (void specification possibly expressed as \"\"\n\tappoints the default system one) and query it for the entities\n\t--sgml : handle SGML Super catalogs for --add and --del\n\t--shell : run a shell allowing interactive queries\n\t--create : create a new catalog\n\t--add \'type\' \'orig\' \'replace\' : add an XML entry\n\t--add \'entry\' : add an SGML entry\n"
           ,*argv);
    puts(
        "\t--del \'values\' : remove values\n\t--noout: avoid dumping the result on stdout\n\t         used with --add or --del, it saves the catalog changes\n\t         and with --sgml it automatically updates the super catalog\n\t--no-super-update: do not update the SGML super catalog\n\t-v --verbose : provide debug information"
        );
    return 1;
  }
  xmlCheckVersion(0x5398);
  iVar17 = 1;
  do {
    pcVar9 = argv[iVar17];
    iVar4 = strcmp(pcVar9,"-");
    if ((iVar4 == 0) || (*pcVar9 != '-')) break;
    iVar4 = strcmp(pcVar9,"-verbose");
    if ((iVar4 == 0) ||
       ((iVar4 = strcmp(pcVar9,"-v"), iVar4 == 0 || (iVar4 = strcmp(pcVar9,"--verbose"), iVar4 == 0)
        ))) {
      verbose = verbose + 1;
      xmlCatalogSetDebug();
    }
    else {
      iVar4 = strcmp(pcVar9,"-noout");
      if ((iVar4 != 0) && (iVar4 = strcmp(pcVar9,"--noout"), iVar4 != 0)) {
        iVar4 = strcmp(pcVar9,"-shell");
        if ((iVar4 != 0) && (iVar4 = strcmp(pcVar9,"--shell"), iVar4 != 0)) {
          iVar4 = strcmp(pcVar9,"-sgml");
          if ((iVar4 == 0) || (iVar4 = strcmp(pcVar9,"--sgml"), iVar4 == 0)) {
            sgml = sgml + 1;
          }
          else {
            iVar4 = strcmp(pcVar9,"-create");
            if ((iVar4 == 0) || (iVar4 = strcmp(pcVar9,"--create"), iVar4 == 0)) {
              create = create + 1;
            }
            else {
              iVar4 = strcmp(pcVar9,"-convert");
              if ((iVar4 == 0) || (iVar4 = strcmp(pcVar9,"--convert"), iVar4 == 0)) {
                convert = convert + 1;
              }
              else {
                iVar4 = strcmp(pcVar9,"-no-super-update");
                if ((iVar4 == 0) || (iVar4 = strcmp(pcVar9,"--no-super-update"), iVar4 == 0)) {
                  no_super_update = no_super_update + 1;
                }
                else {
                  iVar4 = strcmp(pcVar9,"-add");
                  if ((iVar4 == 0) || (iVar4 = strcmp(pcVar9,"--add"), iVar4 == 0)) {
                    iVar17 = iVar17 + 2 + (uint)(sgml == 0);
                    add = add + 1;
                  }
                  else {
                    iVar4 = strcmp(pcVar9,"-del");
                    if ((iVar4 != 0) && (iVar4 = strcmp(pcVar9,"--del"), iVar4 != 0)) {
                      main_cold_1();
                      return 1;
                    }
                    iVar17 = iVar17 + 1;
                    del = del + 1;
                  }
                }
              }
            }
          }
          goto LAB_00102750;
        }
        shell = shell + 1;
      }
      noout = 1;
    }
LAB_00102750:
    iVar17 = iVar17 + 1;
  } while (iVar17 < argc);
  iVar17 = sgml;
  uVar15 = 1;
  do {
    pcVar9 = argv[(int)uVar15];
    iVar4 = strcmp(pcVar9,"-add");
    if ((iVar4 == 0) || (iVar4 = strcmp(pcVar9,"--add"), iVar4 == 0)) {
      if (iVar17 == 0) {
        uVar14 = uVar15 + 3;
      }
      else {
        uVar14 = uVar15 + 2;
      }
    }
    else {
      iVar4 = strcmp(pcVar9,"-del");
      if ((iVar4 == 0) || (iVar4 = strcmp(pcVar9,"--del"), iVar4 == 0)) {
        uVar14 = uVar15 + 1;
        if ((uVar14 == argc) || ((iVar17 != 0 && (uVar15 + 2 == argc)))) {
          main_cold_2();
          return 1;
        }
      }
      else {
        uVar14 = uVar15;
        if (*pcVar9 != '-') {
          if ((*pcVar9 == '\0') && (filename == (char *)0x0)) {
            xmlInitializeCatalog();
          }
          else {
            filename = pcVar9;
            iVar17 = xmlLoadCatalog(pcVar9);
            if ((iVar17 < 0) && (create != 0)) {
              xmlCatalogAdd("catalog",argv[(int)uVar15],0);
            }
            xmlCatalogResolvePublic("");
          }
          break;
        }
      }
    }
    uVar15 = uVar14 + 1;
  } while ((int)uVar15 < argc);
  if (convert != 0) {
    xmlCatalogConvert();
  }
  if (del == 0 && add == 0) {
    if (shell != 0) {
      do {
        fputs("> ",_stdout);
        fflush(_stdout);
        pcVar9 = fgets(local_228,500,_stdin);
        if (pcVar9 == (char *)0x0) {
          pcVar9 = (char *)0x0;
        }
        else {
          local_34 = 0;
          sVar10 = strlen(local_228);
          sVar10 = (size_t)((int)sVar10 + 1);
          pcVar9 = (char *)malloc(sVar10);
          if (pcVar9 != (char *)0x0) {
            memcpy(pcVar9,local_228,sVar10);
          }
        }
        pcVar18 = pcVar9;
        if (pcVar9 == (char *)0x0) goto LAB_001032a9;
        for (; (*pcVar18 == '\t' || (*pcVar18 == ' ')); pcVar18 = pcVar18 + 1) {
        }
        uVar11 = 0;
        while( true ) {
          bVar3 = pcVar18[uVar11];
          if (((ulong)bVar3 < 0x21) && ((0x100002601U >> ((ulong)bVar3 & 0x3f) & 1) != 0)) break;
          *(byte *)((long)&local_4c8 + uVar11) = bVar3;
          uVar11 = uVar11 + 1;
        }
        *(undefined1 *)((long)&local_4c8 + (uVar11 & 0xffffffff)) = 0;
        if (uVar11 != 0) {
          memset(local_3b8,0,400);
          for (pcVar18 = pcVar18 + uVar11; (*pcVar18 == '\t' || (*pcVar18 == ' '));
              pcVar18 = pcVar18 + 1) {
          }
          uVar11 = 0;
          while( true ) {
            bVar3 = pcVar18[uVar11];
            if ((bVar3 < 0xe) && ((0x2401U >> (bVar3 & 0x1f) & 1) != 0)) break;
            local_3b8[uVar11] = bVar3;
            uVar11 = uVar11 + 1;
          }
          local_3b8[uVar11 & 0xffffffff] = 0;
          iVar17 = 0;
          memset(local_458,0,0xa0);
          if (local_3b8[0] != 0) {
            iVar4 = 0;
            iVar17 = 0;
            pbVar13 = local_3b8;
LAB_00102dd7:
            do {
              bVar3 = *pbVar13;
              if (bVar3 < 0x20) {
                if (bVar3 == 9) goto LAB_00102e12;
LAB_00102e36:
                local_458[iVar4] = (long)pbVar13;
                while ((0x20 < (ulong)*pbVar13 ||
                       ((0x100000201U >> ((ulong)*pbVar13 & 0x3f) & 1) == 0))) {
                  pbVar13 = pbVar13 + 1;
                }
LAB_00102e55:
                *pbVar13 = 0;
                iVar17 = iVar17 + 1;
                iVar4 = iVar4 + 1;
                pbVar13 = pbVar13 + 1;
              }
              else {
                if (bVar3 == 0x20) {
LAB_00102e12:
                  pbVar13 = pbVar13 + 1;
                  goto LAB_00102dd7;
                }
                if (bVar3 == 0x22) {
                  pbVar13 = pbVar13 + 1;
                  local_458[iVar4] = (long)pbVar13;
                  for (; *pbVar13 != 0; pbVar13 = pbVar13 + 1) {
                    if (*pbVar13 == 0x22) goto LAB_00102e55;
                  }
                }
                else {
                  if (bVar3 != 0x27) goto LAB_00102e36;
                  pbVar13 = pbVar13 + 1;
                  local_458[iVar4] = (long)pbVar13;
                  for (; *pbVar13 != 0; pbVar13 = pbVar13 + 1) {
                    if (*pbVar13 == 0x27) goto LAB_00102e55;
                  }
                }
              }
            } while (*pbVar13 != 0);
          }
          lVar7 = local_458[0];
          if (((cStack_4c4 == '\0' && local_4c8 == 0x74697865) ||
              (cStack_4c4 == '\0' && local_4c8 == 0x74697571)) || (local_4c8 == 0x657962))
          goto LAB_001032a1;
          if (CONCAT13(uStack_4c2,CONCAT12(uStack_4c3,CONCAT11(cStack_4c4,local_4c8._3_1_))) ==
              0x63696c && local_4c8 == 0x6c627570) {
            if (iVar17 == 1) {
              pcVar18 = (char *)xmlCatalogResolvePublic(local_458[0]);
              if (pcVar18 != (char *)0x0) goto LAB_00102f4e;
              pcVar18 = "No entry for PUBLIC %s\n";
LAB_0010311d:
              printf(pcVar18,lVar7);
              goto LAB_0010317c;
            }
            pcVar18 = "public requires 1 arguments";
          }
          else if (CONCAT13(uStack_4c2,CONCAT12(uStack_4c3,CONCAT11(cStack_4c4,local_4c8._3_1_))) ==
                   0x6d6574 && local_4c8 == 0x74737973) {
            if (iVar17 == 1) {
              pcVar18 = (char *)xmlCatalogResolveSystem(local_458[0]);
              if (pcVar18 == (char *)0x0) {
                pcVar18 = "No entry for SYSTEM %s\n";
                goto LAB_0010311d;
              }
LAB_00102f4e:
              puts(pcVar18);
LAB_00102f5c:
              (*_xmlFree)(pcVar18);
              goto LAB_0010317c;
            }
            pcVar18 = "system requires 1 arguments";
          }
          else if (local_4c8 == 0x6c6564) {
            if (iVar17 == 1) {
              iVar17 = xmlCatalogRemove(local_458[0]);
              if (0 < iVar17) goto LAB_0010317c;
              pcVar18 = "del command failed";
            }
            else {
              pcVar18 = "del requires 1";
            }
          }
          else if (local_4c8 == 0x646461) {
            if (iVar17 - 4U < 0xfffffffe) {
              pcVar18 = "add requires 2 or 3 arguments";
            }
            else {
              lVar7 = local_458[2];
              lVar8 = local_458[1];
              if (local_458[2] == 0) {
                lVar7 = local_458[1];
                lVar8 = 0;
              }
              iVar17 = xmlCatalogAdd(local_458[0],lVar8,lVar7);
              if (iVar17 == 0) goto LAB_0010317c;
              pcVar18 = "add command failed";
            }
          }
          else if (CONCAT17(uStack_4c1,
                            CONCAT16(uStack_4c2,CONCAT15(uStack_4c3,CONCAT14(cStack_4c4,local_4c8)))
                           ) == 0x65766c6f736572) {
            if (iVar17 == 2) {
              pcVar18 = (char *)xmlCatalogResolve(local_458[0],local_458[1]);
              if (pcVar18 != (char *)0x0) {
                puts(pcVar18);
                goto LAB_00102f5c;
              }
              pcVar18 = "Resolver failed to find an answer";
            }
            else {
              pcVar18 = "resolve requires 2 arguments";
            }
          }
          else if (cStack_4c4 == '\0' && local_4c8 == 0x706d7564) {
            if (iVar17 == 0) {
              xmlCatalogDump(_stdout);
              goto LAB_0010317c;
            }
            pcVar18 = "dump has no arguments";
          }
          else if (CONCAT11(uStack_4c3,cStack_4c4) == 0x67 && local_4c8 == 0x75626564) {
            if (iVar17 == 0) {
              verbose = verbose + 1;
LAB_001031c2:
              xmlCatalogSetDebug(verbose);
              goto LAB_0010317c;
            }
            pcVar18 = "debug has no arguments";
          }
          else if (CONCAT11(uStack_4c3,cStack_4c4) == 0x74 && local_4c8 == 0x65697571) {
            if (iVar17 == 0) {
              if (0 < verbose) {
                verbose = verbose + -1;
              }
              goto LAB_001031c2;
            }
            pcVar18 = "quiet has no arguments";
          }
          else {
            if (cStack_4c4 != '\0' || local_4c8 != 0x706c6568) {
              printf("Unrecognized command %s\n",&local_4c8);
            }
            puts("Commands available:");
            puts("\tpublic PublicID: make a PUBLIC identifier lookup");
            puts("\tsystem SystemID: make a SYSTEM identifier lookup");
            puts("\tresolve PublicID SystemID: do a full resolver lookup");
            puts("\tadd \'type\' \'orig\' \'replace\' : add an entry");
            puts("\tdel \'values\' : remove values");
            puts("\tdump: print the current catalog state");
            puts("\tdebug: increase the verbosity level");
            puts("\tquiet: decrease the verbosity level");
            pcVar18 = "\texit:  quit the shell";
          }
          puts(pcVar18);
        }
LAB_0010317c:
        free(pcVar9);
      } while( true );
    }
    iVar17 = uVar15 + 1;
    local_4d8 = 0;
    if (iVar17 < argc) {
      lVar7 = 0;
      local_4d8 = 0;
      do {
        lVar8 = xmlParseURI(argv[iVar17 + lVar7]);
        if (lVar8 == 0) {
          pcVar9 = (char *)xmlCatalogResolvePublic(argv[iVar17 + lVar7]);
          if (pcVar9 != (char *)0x0) goto LAB_00103264;
          pcVar9 = argv[iVar17 + lVar7];
          pcVar18 = "No entry for PUBLIC %s\n";
LAB_00103283:
          printf(pcVar18,pcVar9);
          local_4d8 = 4;
        }
        else {
          xmlFreeURI(lVar8);
          pcVar9 = (char *)xmlCatalogResolveSystem(argv[iVar17 + lVar7]);
          if (pcVar9 == (char *)0x0) {
            printf("No entry for SYSTEM %s\n",argv[iVar17 + lVar7]);
            pcVar9 = (char *)xmlCatalogResolveURI(argv[iVar17 + lVar7]);
            if (pcVar9 == (char *)0x0) {
              pcVar9 = argv[iVar17 + lVar7];
              pcVar18 = "No entry for URI %s\n";
              goto LAB_00103283;
            }
          }
LAB_00103264:
          puts(pcVar9);
          (*_xmlFree)(pcVar9);
        }
        lVar7 = lVar7 + 1;
      } while (~uVar15 + argc != (int)lVar7);
    }
  }
  else {
    local_4d8 = 0;
    iVar17 = 1;
    do {
      pcVar9 = argv[iVar17];
      iVar4 = strcmp(pcVar9,"-");
      if (iVar4 == 0) break;
      iVar4 = iVar17;
      if ((*pcVar9 == '-') &&
         (((iVar5 = strcmp(pcVar9,"-add"), iVar5 == 0 ||
           (iVar6 = strcmp(pcVar9,"--add"), iVar6 == 0)) ||
          ((iVar6 = strcmp(pcVar9,"-del"), iVar6 == 0 ||
           (iVar6 = strcmp(pcVar9,"--del"), iVar6 == 0)))))) {
        ppcVar2 = argv + iVar17;
        if (sgml == 0) {
          if ((iVar5 == 0) || (iVar5 = strcmp(pcVar9,"--add"), iVar5 == 0)) {
            pcVar9 = argv[(long)iVar17 + 3];
            if ((pcVar9 == (char *)0x0) || (*pcVar9 == '\0')) {
              pcVar18 = ppcVar2[1];
              pcVar9 = ppcVar2[2];
              pcVar16 = (char *)0x0;
            }
            else {
              pcVar18 = ppcVar2[1];
              pcVar16 = ppcVar2[2];
            }
            iVar5 = xmlCatalogAdd(pcVar18,pcVar16,pcVar9);
            iVar4 = iVar17 + 3;
            if (iVar5 != 0) {
              puts("add command failed");
              local_4d8 = 3;
            }
          }
          else {
            iVar5 = strcmp(pcVar9,"-del");
            if ((iVar5 == 0) || (iVar5 = strcmp(pcVar9,"--del"), iVar5 == 0)) {
              iVar4 = iVar17 + 1;
              iVar17 = xmlCatalogRemove(argv[(long)iVar17 + 1]);
              if (iVar17 < 0) {
                main_cold_7();
                local_4d8 = 1;
              }
            }
          }
        }
        else {
          ppcVar1 = ppcVar2 + 1;
          lVar7 = xmlLoadSGMLSuperCatalog(ppcVar2[1]);
          pcVar9 = *ppcVar2;
          iVar4 = strcmp(pcVar9,"-add");
          if ((iVar4 == 0) || (iVar4 = strcmp(pcVar9,"--add"), iVar4 == 0)) {
            if (lVar7 == 0) {
              lVar7 = xmlNewCatalog(1);
            }
            xmlACatalogAdd(lVar7,"CATALOG",ppcVar2[2],0);
            if (no_super_update != 0) goto LAB_00102a1e;
            lVar8 = xmlLoadSGMLSuperCatalog("/usr/local/etc/sgml/catalog");
            if (lVar8 == 0) {
              lVar8 = xmlNewCatalog(1);
            }
            xmlACatalogAdd(lVar8,"CATALOG",*ppcVar1,0);
          }
          else {
            if ((lVar7 == 0) || (iVar4 = xmlACatalogRemove(lVar7,ppcVar2[2]), iVar4 < 0)) {
              main_cold_3();
              local_4d8 = 1;
            }
            if (lVar7 == 0) {
LAB_00102a1e:
              lVar8 = 0;
            }
            else if ((((no_super_update == 0) && ((noout & 1) != 0)) &&
                     (iVar4 = xmlCatalogIsEmpty(lVar7), iVar4 != 0)) &&
                    (lVar8 = xmlLoadSGMLSuperCatalog("/usr/local/etc/sgml/catalog"), lVar8 != 0)) {
              iVar4 = xmlACatalogRemove(lVar8,*ppcVar1);
              if (iVar4 < 0) {
                main_cold_4();
                local_4d8 = 1;
              }
            }
            else {
              lVar8 = 0;
            }
          }
          if (noout == 1) {
            iVar4 = xmlCatalogIsEmpty(lVar7);
            if (iVar4 == 0) {
              pFVar12 = fopen64(*ppcVar1,"wb");
              if (pFVar12 == (FILE *)0x0) {
                main_cold_5();
                local_4d8 = 2;
              }
              else {
                xmlACatalogDump(lVar7,pFVar12);
                fclose(pFVar12);
              }
            }
            else {
              remove(*ppcVar1);
            }
            if ((lVar8 != 0) && (no_super_update == 0)) {
              iVar4 = xmlCatalogIsEmpty(lVar8);
              if (iVar4 == 0) {
                pFVar12 = fopen64("/usr/local/etc/sgml/catalog","wb");
                if (pFVar12 == (FILE *)0x0) {
                  main_cold_6();
                  local_4d8 = 2;
                }
                else {
                  xmlACatalogDump(lVar8,pFVar12);
                  fclose(pFVar12);
                }
              }
              else {
                remove("/usr/local/etc/sgml/catalog");
              }
            }
          }
          else {
            xmlACatalogDump(lVar7,_stdout);
          }
          xmlFreeCatalog(lVar7);
          xmlFreeCatalog(lVar8);
          iVar4 = iVar17 + 2;
        }
      }
      iVar17 = iVar4 + 1;
    } while (iVar17 < argc);
  }
LAB_001032b2:
  if ((sgml == 0) && (((add != 0 || (del != 0)) || ((create != 0 || (convert != 0)))))) {
    pFVar12 = _stdout;
    if ((((filename != (char *)0x0 & noout) == 1) && (*filename != '\0')) &&
       (pFVar12 = fopen64(filename,"wb"), pFVar12 == (FILE *)0x0)) {
      main_cold_8();
      local_4d8 = 2;
    }
    else {
      xmlCatalogDump(pFVar12);
    }
  }
  xmlCleanupParser();
  return local_4d8;
LAB_001032a1:
  free(pcVar9);
LAB_001032a9:
  local_4d8 = 0;
  goto LAB_001032b2;
}

Assistant:

int main(int argc, char **argv) {
    int i;
    int ret;
    int exit_value = 0;

#ifdef _WIN32
    _setmode(_fileno(stdin), _O_BINARY);
    _setmode(_fileno(stdout), _O_BINARY);
    _setmode(_fileno(stderr), _O_BINARY);
#endif

    if (argc <= 1) {
	usage(argv[0]);
	return(1);
    }

    LIBXML_TEST_VERSION
    for (i = 1; i < argc ; i++) {
	if (!strcmp(argv[i], "-"))
	    break;

	if (argv[i][0] != '-')
	    break;
	if ((!strcmp(argv[i], "-verbose")) ||
	    (!strcmp(argv[i], "-v")) ||
	    (!strcmp(argv[i], "--verbose"))) {
	    verbose++;
	    xmlCatalogSetDebug(verbose);
	} else if ((!strcmp(argv[i], "-noout")) ||
	    (!strcmp(argv[i], "--noout"))) {
            noout = 1;
	} else if ((!strcmp(argv[i], "-shell")) ||
	    (!strcmp(argv[i], "--shell"))) {
	    shell++;
            noout = 1;
	} else if ((!strcmp(argv[i], "-sgml")) ||
	    (!strcmp(argv[i], "--sgml"))) {
	    sgml++;
	} else if ((!strcmp(argv[i], "-create")) ||
	    (!strcmp(argv[i], "--create"))) {
	    create++;
	} else if ((!strcmp(argv[i], "-convert")) ||
	    (!strcmp(argv[i], "--convert"))) {
	    convert++;
	} else if ((!strcmp(argv[i], "-no-super-update")) ||
	    (!strcmp(argv[i], "--no-super-update"))) {
	    no_super_update++;
	} else if ((!strcmp(argv[i], "-add")) ||
	    (!strcmp(argv[i], "--add"))) {
	    if (sgml)
		i += 2;
	    else
		i += 3;
	    add++;
	} else if ((!strcmp(argv[i], "-del")) ||
	    (!strcmp(argv[i], "--del"))) {
	    i += 1;
	    del++;
	} else {
	    fprintf(stderr, "Unknown option %s\n", argv[i]);
	    usage(argv[0]);
	    return(1);
	}
    }

    for (i = 1; i < argc; i++) {
	if ((!strcmp(argv[i], "-add")) ||
	    (!strcmp(argv[i], "--add"))) {
	    if (sgml)
		i += 2;
	    else
		i += 3;
	    continue;
	} else if ((!strcmp(argv[i], "-del")) ||
	    (!strcmp(argv[i], "--del"))) {
	    i += 1;

	    /* No catalog entry specified */
	    if (i == argc || (sgml && i + 1 == argc)) {
		fprintf(stderr, "No catalog entry specified to remove from\n");
		usage (argv[0]);
		return(1);
	    }

	    continue;
	} else if (argv[i][0] == '-')
	    continue;

	if (filename == NULL && argv[i][0] == '\0') {
	    /* Interpret empty-string catalog specification as
	       a shortcut for a default system catalog. */
	    xmlInitializeCatalog();
	} else {
	    filename = argv[i];
	    ret = xmlLoadCatalog(argv[i]);
	    if ((ret < 0) && (create)) {
		xmlCatalogAdd(BAD_CAST "catalog", BAD_CAST argv[i], NULL);
	    }

            /*
             * Catalogs are loaded lazily. Make sure that dumping works
             * by the issuing a dummy request that forces the catalog to
             * be loaded.
             */
            xmlCatalogResolvePublic(BAD_CAST "");
	}
	break;
    }

    if (convert)
        ret = xmlCatalogConvert();

    if ((add) || (del)) {
	for (i = 1; i < argc ; i++) {
	    if (!strcmp(argv[i], "-"))
		break;

	    if (argv[i][0] != '-')
		continue;
	    if (strcmp(argv[i], "-add") && strcmp(argv[i], "--add") &&
		strcmp(argv[i], "-del") && strcmp(argv[i], "--del"))
		continue;

	    if (sgml) {
		/*
		 * Maintenance of SGML catalogs.
		 */
		xmlCatalogPtr catal = NULL;
		xmlCatalogPtr super = NULL;

		catal = xmlLoadSGMLSuperCatalog(argv[i + 1]);

		if ((!strcmp(argv[i], "-add")) ||
		    (!strcmp(argv[i], "--add"))) {
		    if (catal == NULL)
			catal = xmlNewCatalog(1);
		    xmlACatalogAdd(catal, BAD_CAST "CATALOG",
					 BAD_CAST argv[i + 2], NULL);

		    if (!no_super_update) {
			super = xmlLoadSGMLSuperCatalog(XML_SGML_DEFAULT_CATALOG);
			if (super == NULL)
			    super = xmlNewCatalog(1);

			xmlACatalogAdd(super, BAD_CAST "CATALOG",
					     BAD_CAST argv[i + 1], NULL);
		    }
		} else {
		    if (catal != NULL)
			ret = xmlACatalogRemove(catal, BAD_CAST argv[i + 2]);
		    else
			ret = -1;
		    if (ret < 0) {
			fprintf(stderr, "Failed to remove entry from %s\n",
				argv[i + 1]);
			exit_value = 1;
		    }
		    if ((!no_super_update) && (noout) && (catal != NULL) &&
			(xmlCatalogIsEmpty(catal))) {
			super = xmlLoadSGMLSuperCatalog(
				   XML_SGML_DEFAULT_CATALOG);
			if (super != NULL) {
			    ret = xmlACatalogRemove(super,
				    BAD_CAST argv[i + 1]);
			    if (ret < 0) {
				fprintf(stderr,
					"Failed to remove entry from %s\n",
					XML_SGML_DEFAULT_CATALOG);
				exit_value = 1;
			    }
			}
		    }
		}
		if (noout) {
		    FILE *out;

		    if (xmlCatalogIsEmpty(catal)) {
			remove(argv[i + 1]);
		    } else {
			out = fopen(argv[i + 1], "wb");
			if (out == NULL) {
			    fprintf(stderr, "could not open %s for saving\n",
				    argv[i + 1]);
			    exit_value = 2;
			    noout = 0;
			} else {
			    xmlACatalogDump(catal, out);
			    fclose(out);
			}
		    }
		    if (!no_super_update && super != NULL) {
			if (xmlCatalogIsEmpty(super)) {
			    remove(XML_SGML_DEFAULT_CATALOG);
			} else {
			    out = fopen(XML_SGML_DEFAULT_CATALOG, "wb");
			    if (out == NULL) {
				fprintf(stderr,
					"could not open %s for saving\n",
					XML_SGML_DEFAULT_CATALOG);
				exit_value = 2;
				noout = 0;
			    } else {

				xmlACatalogDump(super, out);
				fclose(out);
			    }
			}
		    }
		} else {
		    xmlACatalogDump(catal, stdout);
		}
		i += 2;

                xmlFreeCatalog(catal);
                xmlFreeCatalog(super);
	    } else {
		if ((!strcmp(argv[i], "-add")) ||
		    (!strcmp(argv[i], "--add"))) {
			if ((argv[i + 3] == NULL) || (argv[i + 3][0] == 0))
			    ret = xmlCatalogAdd(BAD_CAST argv[i + 1], NULL,
						BAD_CAST argv[i + 2]);
			else
			    ret = xmlCatalogAdd(BAD_CAST argv[i + 1],
						BAD_CAST argv[i + 2],
						BAD_CAST argv[i + 3]);
			if (ret != 0) {
			    printf("add command failed\n");
			    exit_value = 3;
			}
			i += 3;
		} else if ((!strcmp(argv[i], "-del")) ||
		    (!strcmp(argv[i], "--del"))) {
		    ret = xmlCatalogRemove(BAD_CAST argv[i + 1]);
		    if (ret < 0) {
			fprintf(stderr, "Failed to remove entry %s\n",
				argv[i + 1]);
			exit_value = 1;
		    }
		    i += 1;
		}
	    }
	}

    } else if (shell) {
	usershell();
    } else {
	for (i++; i < argc; i++) {
	    xmlURIPtr uri;
	    xmlChar *ans;

	    uri = xmlParseURI(argv[i]);
	    if (uri == NULL) {
		ans = xmlCatalogResolvePublic((const xmlChar *) argv[i]);
		if (ans == NULL) {
		    printf("No entry for PUBLIC %s\n", argv[i]);
		    exit_value = 4;
		} else {
		    printf("%s\n", (char *) ans);
		    xmlFree(ans);
		}
	    } else {
                xmlFreeURI(uri);
		ans = xmlCatalogResolveSystem((const xmlChar *) argv[i]);
		if (ans == NULL) {
		    printf("No entry for SYSTEM %s\n", argv[i]);
		    ans = xmlCatalogResolveURI ((const xmlChar *) argv[i]);
		    if (ans == NULL) {
			printf ("No entry for URI %s\n", argv[i]);
		        exit_value = 4;
		    } else {
		        printf("%s\n", (char *) ans);
			xmlFree (ans);
		    }
		} else {
		    printf("%s\n", (char *) ans);
		    xmlFree(ans);
		}
	    }
	}
    }
    if ((!sgml) && ((add) || (del) || (create) || (convert))) {
	if (noout && filename && *filename) {
	    FILE *out;

	    out = fopen(filename, "wb");
	    if (out == NULL) {
		fprintf(stderr, "could not open %s for saving\n", filename);
		exit_value = 2;
		noout = 0;
	    } else {
		xmlCatalogDump(out);
	    }
	} else {
	    xmlCatalogDump(stdout);
	}
    }

    /*
     * Cleanup and check for memory leaks
     */
    xmlCleanupParser();
    return(exit_value);
}